

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransportamqp_methods.c
# Opt level: O3

void iothubtransportamqp_methods_destroy
               (IOTHUBTRANSPORT_AMQP_METHODS_HANDLE iothubtransport_amqp_methods_handle)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  ulong uVar1;
  
  if (iothubtransport_amqp_methods_handle != (IOTHUBTRANSPORT_AMQP_METHODS_HANDLE)0x0) {
    if (iothubtransport_amqp_methods_handle->subscribe_state == SUBSCRIBE_STATE_SUBSCRIBED) {
      iothubtransportamqp_methods_unsubscribe(iothubtransport_amqp_methods_handle);
    }
    if (iothubtransport_amqp_methods_handle->method_request_handle_count != 0) {
      uVar1 = 0;
      do {
        free(iothubtransport_amqp_methods_handle->method_request_handles[uVar1]);
        uVar1 = uVar1 + 1;
      } while (uVar1 < iothubtransport_amqp_methods_handle->method_request_handle_count);
    }
    if (iothubtransport_amqp_methods_handle->method_request_handles !=
        (IOTHUBTRANSPORT_AMQP_METHOD_HANDLE *)0x0) {
      free(iothubtransport_amqp_methods_handle->method_request_handles);
    }
    free(iothubtransport_amqp_methods_handle->hostname);
    free(iothubtransport_amqp_methods_handle->device_id);
    free(iothubtransport_amqp_methods_handle->module_id);
    free(iothubtransport_amqp_methods_handle);
    return;
  }
  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransportamqp_methods.c"
               ,"iothubtransportamqp_methods_destroy",0xa5,1,"NULL handle");
    return;
  }
  return;
}

Assistant:

void iothubtransportamqp_methods_destroy(IOTHUBTRANSPORT_AMQP_METHODS_HANDLE iothubtransport_amqp_methods_handle)
{
    if (iothubtransport_amqp_methods_handle == NULL)
    {
        LogError("NULL handle");
    }
    else
    {
        size_t i;

        if (iothubtransport_amqp_methods_handle->subscribe_state == SUBSCRIBE_STATE_SUBSCRIBED)
        {
            iothubtransportamqp_methods_unsubscribe(iothubtransport_amqp_methods_handle);
        }

        for (i = 0; i < iothubtransport_amqp_methods_handle->method_request_handle_count; i++)
        {
            free(iothubtransport_amqp_methods_handle->method_request_handles[i]);
        }

        if (iothubtransport_amqp_methods_handle->method_request_handles != NULL)
        {
            free(iothubtransport_amqp_methods_handle->method_request_handles);
        }

        free(iothubtransport_amqp_methods_handle->hostname);
        free(iothubtransport_amqp_methods_handle->device_id);
        free(iothubtransport_amqp_methods_handle->module_id);
        free(iothubtransport_amqp_methods_handle);
    }
}